

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

void __thiscall
HistoryBuffer::ReadBuffer
          (HistoryBuffer *this,float *buffer,int numsamplesTarget,int numsamplesSource,float offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_5c;
  float s2;
  float s1;
  int i;
  float f;
  float p;
  int w;
  int n;
  float speed;
  float offset_local;
  int numsamplesSource_local;
  int numsamplesTarget_local;
  float *buffer_local;
  HistoryBuffer *this_local;
  
  iVar3 = numsamplesTarget + -1;
  iVar1 = this->writeindex;
  i = (int)offset;
  for (p = 0.0; (int)p < iVar3; p = (float)((int)p + 1)) {
    s1 = (float)iVar1 - (float)i;
    if (s1 < 0.0) {
      s1 = (float)this->length + s1;
    }
    iVar2 = FastFloor(s1);
    local_5c = iVar2;
    if (iVar2 == 0) {
      local_5c = this->length;
    }
    local_5c = local_5c + -1;
    buffer[(numsamplesTarget + -2) - (int)p] =
         (this->data[iVar2] - this->data[local_5c]) * (s1 - (float)iVar2) + this->data[local_5c];
    i = (int)((float)numsamplesSource / (float)iVar3 + (float)i);
    if ((float)this->length <= (float)i) break;
  }
  buffer[iVar3] = (float)(int)p;
  return;
}

Assistant:

void HistoryBuffer::ReadBuffer(float* buffer, int numsamplesTarget, int numsamplesSource, float offset)
{
    numsamplesTarget--; // reserve last sample for count of how much we were able to read
    float speed = (float)numsamplesSource / (float)numsamplesTarget;
    int n, w = writeindex; // since ReadBuffer is called from the GUI thread, writeindex may be modified by the DSP thread simultaneously
    float p = offset;
    for (n = 0; n < numsamplesTarget; n++)
    {
        float f = w - p;
        if (f < 0.0f)
            f += length;
        int i = FastFloor(f);
        float s1 = data[(i == 0) ? (length - 1) : (i - 1)];
        float s2 = data[i];
        buffer[numsamplesTarget - 1 - n] = s1 + (s2 - s1) * (f - i);
        p += speed;
        if (p >= length)
            break;
    }
    buffer[numsamplesTarget] = (float)n; // how many samples were written
}